

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::ByteCodeGenerator
          (ByteCodeGenerator *this,ScriptContext *scriptContext,ScopeInfo *parentScopeInfo)

{
  this->scriptContext = scriptContext;
  this->alloc = (ArenaAllocator *)0x0;
  this->flags = 0;
  this->funcInfoStack = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->currentScope = (Scope *)0x0;
  this->globalScope = (Scope *)0x0;
  this->parentScopeInfo = parentScopeInfo;
  (this->m_writer).rootObjectLoadInlineCacheOffsets.super_SListNodeBase<Memory::ArenaAllocator>.next
       = &(this->m_writer).rootObjectLoadInlineCacheOffsets.
          super_SListNodeBase<Memory::ArenaAllocator>;
  (this->m_writer).rootObjectLoadInlineCacheOffsets.super_RealCount.count = 0;
  (this->m_writer).rootObjectStoreInlineCacheOffsets.super_SListNodeBase<Memory::ArenaAllocator>.
  next = &(this->m_writer).rootObjectStoreInlineCacheOffsets.
          super_SListNodeBase<Memory::ArenaAllocator>;
  (this->m_writer).rootObjectStoreInlineCacheOffsets.super_RealCount.count = 0;
  (this->m_writer).rootObjectLoadMethodInlineCacheOffsets.
  super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(this->m_writer).rootObjectLoadMethodInlineCacheOffsets.
        super_SListNodeBase<Memory::ArenaAllocator>;
  (this->m_writer).rootObjectLoadMethodInlineCacheOffsets.super_RealCount.count = 0;
  (this->m_writer).m_byteCodeData.tempAllocator = (ArenaAllocator *)0x0;
  (this->m_writer).m_byteCodeData.head = (DataChunk *)0x0;
  *(undefined8 *)((long)&(this->m_writer).m_byteCodeData.head + 5) = 0;
  *(undefined8 *)((long)&(this->m_writer).m_byteCodeData.current + 5) = 0;
  (this->m_writer).m_auxiliaryData.tempAllocator = (ArenaAllocator *)0x0;
  (this->m_writer).m_auxiliaryData.head = (DataChunk *)0x0;
  *(undefined8 *)((long)&(this->m_writer).m_auxiliaryData.head + 5) = 0;
  *(undefined8 *)((long)&(this->m_writer).m_auxiliaryData.current + 5) = 0;
  (this->m_writer).m_auxContextData.tempAllocator = (ArenaAllocator *)0x0;
  (this->m_writer).m_auxContextData.head = (DataChunk *)0x0;
  *(undefined8 *)((long)&(this->m_writer).m_auxContextData.head + 5) = 0;
  *(undefined8 *)((long)&(this->m_writer).m_auxContextData.current + 5) = 0;
  (this->m_writer).spanIter.accumulatedIndex = -1;
  (this->m_writer).spanIter.accumulatedSourceBegin = 0;
  (this->m_writer).spanIter.accumulatedBytecodeBegin = 0;
  (this->m_writer).spanIter.indexOfActualOffset = 0;
  (this->m_writer).m_byteCodeCount = 1;
  (this->m_writer).m_currentDebuggerScope = (DebuggerScope *)0x0;
  this->pRootFunc = (ParseableFunctionInfo *)0x0;
  this->jumpCleanupList = (JumpCleanupList *)0x0;
  this->dynamicScopeCount = 0;
  this->isBinding = false;
  this->inDestructuredPattern = false;
  this->pCurrentFunction = (FunctionBody *)0x0;
  this->forceStrictModeForClassComputedPropertyName = false;
  (this->tryScopeRecordsList).head = (Type)0x0;
  (this->tryScopeRecordsList).tail = (Type)0x0;
  Js::ByteCodeWriter::Create(&this->m_writer);
  return;
}

Assistant:

ByteCodeGenerator::ByteCodeGenerator(Js::ScriptContext* scriptContext, Js::ScopeInfo* parentScopeInfo) :
    alloc(nullptr),
    scriptContext(scriptContext),
    flags(0),
    funcInfoStack(nullptr),
    jumpCleanupList(nullptr),
    pRootFunc(nullptr),
    pCurrentFunction(nullptr),
    globalScope(nullptr),
    currentScope(nullptr),
    parentScopeInfo(parentScopeInfo),
    dynamicScopeCount(0),
    isBinding(false),
    inDestructuredPattern(false)
{
    m_writer.Create();
}